

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

example * __thiscall example_initializer::operator()(example_initializer *this,example *ex)

{
  example *in_RSI;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  size_t local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  size_t local_18;
  
  memset(&in_RSI->l,0,0x28);
  in_RSI->in_use = false;
  in_RSI->passthrough = (features *)0x0;
  v_init<char>();
  (in_RSI->tag)._begin = local_30;
  (in_RSI->tag)._end = local_28;
  (in_RSI->tag).end_array = local_20;
  (in_RSI->tag).erase_count = local_18;
  v_init<unsigned_char>();
  (in_RSI->super_example_predict).indices._begin = local_50;
  (in_RSI->super_example_predict).indices._end = local_48;
  (in_RSI->super_example_predict).indices.end_array = local_40;
  (in_RSI->super_example_predict).indices.erase_count = local_38;
  memset((in_RSI->super_example_predict).feature_space,0,0x6800);
  return in_RSI;
}

Assistant:

example* example_initializer::operator()(example* ex)
{
  memset(&ex->l, 0, sizeof(polylabel));
  ex->in_use = false;
  ex->passthrough = nullptr;
  ex->tag = v_init<char>();
  ex->indices = v_init<namespace_index>();
  memset(&ex->feature_space, 0, sizeof(ex->feature_space));
  return ex;
}